

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86.h
# Opt level: O2

void calculate_dqcoeff_and_store_log_scale
               (__m128i qcoeff,__m128i dequant,__m128i zero,tran_low_t *dqcoeff,int *log_scale)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar5 [16];
  
  auVar5 = vpsraw_avx(in_ZMM0._0_16_,0xf);
  auVar1 = vpabsw_avx(in_ZMM0._0_16_);
  auVar2 = vpmovzxwd_avx(auVar5);
  auVar3 = vpunpckhwd_avx(auVar5,(undefined1  [16])0x0);
  auVar5 = vpmullw_avx(auVar1,in_ZMM1._0_16_);
  auVar1 = vpmulhw_avx(auVar1,in_ZMM1._0_16_);
  auVar4 = vpunpcklwd_avx(auVar5,auVar1);
  auVar5 = vpunpckhwd_avx(auVar5,auVar1);
  auVar1 = vpsrld_avx(auVar4,ZEXT416(*(uint *)qcoeff[1]));
  auVar5 = vpsrld_avx(auVar5,ZEXT416(*(uint *)qcoeff[1]));
  auVar1 = vpsubd_avx(auVar1 ^ auVar2,auVar2);
  auVar2 = vpsubd_avx(auVar5 ^ auVar3,auVar3);
  *(undefined1 (*) [16])qcoeff[0] = auVar1;
  *(undefined1 (*) [16])(qcoeff[0] + 0x10) = auVar2;
  return;
}

Assistant:

static inline void calculate_dqcoeff_and_store_log_scale(__m128i qcoeff,
                                                         __m128i dequant,
                                                         const __m128i zero,
                                                         tran_low_t *dqcoeff,
                                                         const int *log_scale) {
  // calculate abs
  __m128i coeff_sign = _mm_srai_epi16(qcoeff, 15);
  __m128i coeff = invert_sign_sse2(qcoeff, coeff_sign);

  const __m128i sign_0 = _mm_unpacklo_epi16(coeff_sign, zero);
  const __m128i sign_1 = _mm_unpackhi_epi16(coeff_sign, zero);

  const __m128i low = _mm_mullo_epi16(coeff, dequant);
  const __m128i high = _mm_mulhi_epi16(coeff, dequant);
  __m128i dqcoeff32_0 = _mm_unpacklo_epi16(low, high);
  __m128i dqcoeff32_1 = _mm_unpackhi_epi16(low, high);

  dqcoeff32_0 = _mm_srli_epi32(dqcoeff32_0, *log_scale);
  dqcoeff32_1 = _mm_srli_epi32(dqcoeff32_1, *log_scale);

  dqcoeff32_0 = invert_sign_32_sse2(dqcoeff32_0, sign_0);
  dqcoeff32_1 = invert_sign_32_sse2(dqcoeff32_1, sign_1);

  _mm_store_si128((__m128i *)(dqcoeff), dqcoeff32_0);
  _mm_store_si128((__m128i *)(dqcoeff + 4), dqcoeff32_1);
}